

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O0

void __thiscall
Js::DiagStackFrame::EvaluateImmediate
          (DiagStackFrame *this,char16 *source,int sourceLength,BOOL isLibraryCode,
          ResolvedObject *resolvedObject)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ScriptFunction *pfuncScript_00;
  FunctionBody *pFVar4;
  Var pvVar5;
  FunctionBody *pCurrentFuncBody;
  FunctionBody *body;
  ScriptFunction *pfuncScript;
  ResolvedObject *resolvedObject_local;
  BOOL isLibraryCode_local;
  int sourceLength_local;
  char16 *source_local;
  DiagStackFrame *this_local;
  
  TryFetchValueAndAddress(this,source,sourceLength,resolvedObject);
  if (resolvedObject->obj == (Var)0x0) {
    iVar2 = (*this->_vptr_DiagStackFrame[10])();
    pfuncScript_00 =
         TryGetFunctionForEval
                   (this,(ScriptContext *)CONCAT44(extraout_var,iVar2),source,sourceLength,
                    isLibraryCode);
    if (pfuncScript_00 != (ScriptFunction *)0x0) {
      pFVar4 = GetFunction(this);
      if (((pFVar4 == (FunctionBody *)0x0) ||
          (bVar1 = ParseableFunctionInfo::IsNonUserCode(&pFVar4->super_ParseableFunctionInfo), bVar1
          )) && (pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pfuncScript_00),
                pFVar4 != (FunctionBody *)0x0)) {
        ParseableFunctionInfo::SetIsNonUserCode(&pFVar4->super_ParseableFunctionInfo,true);
      }
      uVar3 = IsStrictMode(this);
      Output::Trace(ConsoleScopePhase,
                    L"EvaluateImmediate strict = %d, libraryCode = %d, source = \'%s\'\n",
                    (ulong)uVar3,(ulong)(uint)isLibraryCode,source);
      pvVar5 = DoEval(this,pfuncScript_00);
      resolvedObject->obj = pvVar5;
    }
  }
  return;
}

Assistant:

void DiagStackFrame::EvaluateImmediate(const char16 *source, int sourceLength, BOOL isLibraryCode, Js::ResolvedObject * resolvedObject)
    {
        this->TryFetchValueAndAddress(source, sourceLength, resolvedObject);

        if (resolvedObject->obj == nullptr)
        {
            Js::ScriptFunction* pfuncScript = this->TryGetFunctionForEval(this->GetScriptContext(), source, sourceLength, isLibraryCode);
            if (pfuncScript != nullptr)
            {
                // Passing the nonuser code state from the enclosing function to the current function.
                // Treat native library frame (no function body) as non-user code.
                Js::FunctionBody* body = this->GetFunction();
                if (!body || body->IsNonUserCode())
                {
                    Js::FunctionBody *pCurrentFuncBody = pfuncScript->GetFunctionBody();
                    if (pCurrentFuncBody != nullptr)
                    {
                        pCurrentFuncBody->SetIsNonUserCode(true);
                    }
                }
                OUTPUT_TRACE(Js::ConsoleScopePhase, _u("EvaluateImmediate strict = %d, libraryCode = %d, source = '%s'\n"),
                    this->IsStrictMode(), isLibraryCode, source);
                resolvedObject->obj = this->DoEval(pfuncScript);
            }
        }
    }